

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_31::HttpClientAdapter::ResponseImpl::~ResponseImpl(ResponseImpl *this)

{
  ResponseImpl *this_local;
  
  Promise<void>::~Promise(&this->task);
  Own<kj::PromiseFulfiller<kj::HttpClient::Response>_>::~Own(&this->fulfiller);
  Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

ResponseImpl(kj::HttpMethod method,
                 kj::Own<kj::PromiseFulfiller<HttpClient::Response>> fulfiller)
        : method(method), fulfiller(kj::mv(fulfiller)) {}